

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall Imf_3_2::RgbaOutputFile::writePixels(RgbaOutputFile *this,int numScanLines)

{
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  int in_stack_000001cc;
  ToYca *in_stack_000001d0;
  int in_stack_0000026c;
  OutputFile *in_stack_00000270;
  mutex_type *in_stack_ffffffffffffffc8;
  
  if (in_RDI[2]._M_device == (mutex_type *)0x0) {
    OutputFile::writePixels(in_stack_00000270,in_stack_0000026c);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffc8);
    ToYca::writePixels(in_stack_000001d0,in_stack_000001cc);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x24bf3f);
  }
  return;
}

Assistant:

void
RgbaOutputFile::writePixels (int numScanLines)
{
    if (_toYca)
    {
        std::lock_guard<std::mutex> lock (*_toYca);
        _toYca->writePixels (numScanLines);
    }
    else
    {
        _outputFile->writePixels (numScanLines);
    }
}